

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O0

bool deqp::egl::anon_unknown_3::checkVersionQueries(TestLog *log,Functions *gl,int major,int minor)

{
  GLenum GVar1;
  MessageBuilder *pMVar2;
  MessageBuilder local_340;
  MessageBuilder local_1b0;
  GLint local_30;
  GLint local_2c;
  deInt32 minorVersion;
  deInt32 majorVersion;
  int minor_local;
  int major_local;
  Functions *gl_local;
  TestLog *log_local;
  
  local_2c = 0;
  local_30 = 0;
  minorVersion = minor;
  majorVersion = major;
  _minor_local = gl;
  gl_local = (Functions *)log;
  (*gl->getIntegerv)(0x821b,&local_2c);
  GVar1 = (*_minor_local->getError)();
  glu::checkError(GVar1,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                  ,0x27c);
  (*_minor_local->getIntegerv)(0x821c,&local_30);
  GVar1 = (*_minor_local->getError)();
  glu::checkError(GVar1,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                  ,0x27f);
  if ((local_2c < majorVersion) || ((local_2c == majorVersion && (local_30 < minorVersion)))) {
    if (local_2c < majorVersion) {
      tcu::TestLog::operator<<
                (&local_1b0,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<
                         (&local_1b0,(char (*) [43])"glGetIntegerv(GL_MAJOR_VERSION) returned \'");
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_2c);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [22])"\' expected at least \'");
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&majorVersion);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x584ef5);
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    }
    else if ((local_2c == majorVersion) && (local_30 < minorVersion)) {
      tcu::TestLog::operator<<
                (&local_340,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<
                         (&local_340,(char (*) [43])"glGetIntegerv(GL_MINOR_VERSION) returned \'");
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_30);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [13])"\' expected \'");
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&minorVersion);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x584ef5);
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_340);
    }
    log_local._7_1_ = false;
  }
  else {
    log_local._7_1_ = true;
  }
  return log_local._7_1_;
}

Assistant:

bool checkVersionQueries (TestLog& log, const glw::Functions& gl, int major, int minor)
{
	deInt32 majorVersion = 0;
	deInt32	minorVersion = 0;

	gl.getIntegerv(GL_MAJOR_VERSION, &majorVersion);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

	gl.getIntegerv(GL_MINOR_VERSION, &minorVersion);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

	if (majorVersion < major || (majorVersion == major && minorVersion < minor))
	{
		if (majorVersion < major)
			log << TestLog::Message << "glGetIntegerv(GL_MAJOR_VERSION) returned '" << majorVersion << "' expected at least '" << major << "'" << TestLog::EndMessage;
		else if (majorVersion == major && minorVersion < minor)
			log << TestLog::Message << "glGetIntegerv(GL_MINOR_VERSION) returned '" << minorVersion << "' expected '" << minor << "'" << TestLog::EndMessage;
		else
			DE_ASSERT(false);

		return false;
	}
	else
		return true;
}